

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_vfs_register(sqlite3_vfs *pVfs,int makeDflt)

{
  bool bVar1;
  int iVar2;
  sqlite3_mutex *psVar3;
  sqlite3_vfs *psVar4;
  sqlite3_vfs **ppsVar5;
  sqlite3_vfs *psVar6;
  
  iVar2 = sqlite3_initialize();
  if (iVar2 != 0) {
    return iVar2;
  }
  bVar1 = true;
  if ((sqlite3Config.bCoreMutex == 0) ||
     (psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar3 == (sqlite3_mutex *)0x0)) {
    psVar3 = (sqlite3_mutex *)0x0;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(psVar3);
    bVar1 = false;
  }
  if (pVfs != (sqlite3_vfs *)0x0) {
    if (vfsList == pVfs) {
      ppsVar5 = &vfsList;
    }
    else {
      psVar4 = vfsList;
      if (vfsList == (sqlite3_vfs *)0x0) {
        ppsVar5 = &vfsList;
        psVar4 = (sqlite3_vfs *)0x0;
        goto LAB_0011c64d;
      }
      do {
        psVar6 = psVar4;
        psVar4 = psVar6->pNext;
        if (psVar4 == (sqlite3_vfs *)0x0) break;
      } while (psVar4 != pVfs);
      if (psVar4 != pVfs) goto LAB_0011c61f;
      ppsVar5 = &psVar6->pNext;
    }
    *ppsVar5 = pVfs->pNext;
  }
LAB_0011c61f:
  if (vfsList == (sqlite3_vfs *)0x0 || makeDflt != 0) {
    ppsVar5 = &vfsList;
    psVar4 = vfsList;
  }
  else {
    psVar4 = vfsList->pNext;
    ppsVar5 = &vfsList->pNext;
  }
LAB_0011c64d:
  pVfs->pNext = psVar4;
  *ppsVar5 = pVfs;
  if (!bVar1) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_vfs_register(sqlite3_vfs *pVfs, int makeDflt){
  MUTEX_LOGIC(sqlite3_mutex *mutex;)
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pVfs==0 ) return SQLITE_MISUSE_BKPT;
#endif

  MUTEX_LOGIC( mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER); )
  sqlite3_mutex_enter(mutex);
  vfsUnlink(pVfs);
  if( makeDflt || vfsList==0 ){
    pVfs->pNext = vfsList;
    vfsList = pVfs;
  }else{
    pVfs->pNext = vfsList->pNext;
    vfsList->pNext = pVfs;
  }
  assert(vfsList);
  sqlite3_mutex_leave(mutex);
  return SQLITE_OK;
}